

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

bool __thiscall nite::Color::cInterp(Color *this,Color *f,float Step)

{
  bool bVar1;
  Color local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  local_2c = Step;
  bVar1 = operator==(this,f);
  if (!bVar1) {
    Color(&local_4c,f);
    local_30 = local_4c.r * 100.0;
    local_34 = local_4c.g * 100.0;
    local_38 = local_4c.b * 100.0;
    local_3c = local_4c.a * 100.0;
    to100(this);
    nite::cInterp(&this->r,local_30,local_2c);
    nite::cInterp(&this->g,local_34,local_2c);
    nite::cInterp(&this->b,local_38,local_2c);
    nite::cInterp(&this->a,local_3c,local_2c);
    to1(this);
    rectify(this);
  }
  return bVar1;
}

Assistant:

bool nite::Color::cInterp(const Color &f, float Step){
	if(*this == f) return true;
	auto copy = f;
	copy.to100();
	this->to100();
	nite::cInterp(r, copy.r, Step);
	nite::cInterp(g, copy.g, Step);
	nite::cInterp(b, copy.b, Step);
	nite::cInterp(a, copy.a, Step);
	this->to1();	
	rectify();
	return false;
}